

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O3

uint64_t kratos::hash_64_fnv1a(void *key,uint64_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar2 = 0xcbf29ce484222325;
  if (len == 0) {
    uVar2 = 0xcbf29ce484222325;
  }
  else {
    uVar1 = 0;
    do {
      uVar2 = (*(byte *)((long)key + uVar1) ^ uVar2) * 0x100000001b3;
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  return uVar2;
}

Assistant:

uint64_t hash_64_fnv1a(const void* key, uint64_t len) {
    auto const* data = static_cast<const char*>(key);
    uint64_t hash = 0xcbf29ce484222325;
    uint64_t prime = 0x100000001b3;

    for (uint64_t i = 0; i < len; ++i) {
        uint8_t value = data[i];
        hash = hash ^ value;
        hash *= prime;
    }

    return hash;

}